

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Amplify_SSE2(float *output,uint32_t totalSamples,float volume)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_84;
  __m128 outVec;
  __m128 volumeVec;
  uint32_t tail;
  uint32_t header;
  uint32_t i;
  float volume_local;
  uint32_t totalSamples_local;
  float *output_local;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  outVec[0] = (float)(0x10 - ((ulong)output & 0xf) >> 2);
  local_84 = totalSamples - (int)outVec[0] & 3;
  if (outVec[0] == 5.60519e-45) {
    outVec[0] = 0.0;
  }
  if (local_84 == 4) {
    local_84 = 0;
  }
  for (outVec[1] = 0.0; (uint)outVec[1] < (uint)outVec[0]; outVec[1] = (float)((int)outVec[1] + 1))
  {
    output[(uint)outVec[1]] = volume * output[(uint)outVec[1]];
  }
  for (outVec[1] = outVec[0]; (uint)outVec[1] < totalSamples - local_84;
      outVec[1] = (float)((int)outVec[1] + 4)) {
    uVar1 = *(undefined8 *)(output + (uint)outVec[1]);
    uVar2 = *(undefined8 *)(output + (uint)outVec[1] + 2);
    local_38 = (float)uVar1;
    fStack_34 = (float)((ulong)uVar1 >> 0x20);
    fStack_30 = (float)uVar2;
    fStack_2c = (float)((ulong)uVar2 >> 0x20);
    local_a8 = CONCAT44(fStack_34 * volume,local_38 * volume);
    uStack_a0 = CONCAT44(fStack_2c * volume,fStack_30 * volume);
    *(undefined8 *)(output + (uint)outVec[1]) = local_a8;
    *(undefined8 *)(output + (uint)outVec[1] + 2) = uStack_a0;
  }
  for (outVec[1] = (float)(totalSamples - local_84); (uint)outVec[1] < totalSamples;
      outVec[1] = (float)((int)outVec[1] + 1)) {
    output[(uint)outVec[1]] = volume * output[(uint)outVec[1]];
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Amplify_SSE2(
	float* output,
	uint32_t totalSamples,
	float volume
) {
	uint32_t i;
	uint32_t header = (16 - (((size_t) output) % 16)) / 4;
	uint32_t tail = (totalSamples - header) % 4;
	__m128 volumeVec, outVec;
	if (header == 4)
	{
		header = 0;
	}
	if (tail == 4)
	{
		tail = 0;
	}

	for (i = 0; i < header; i += 1)
	{
		output[i] *= volume;
	}

	volumeVec = _mm_set1_ps(volume);
	for (i = header; i < totalSamples - tail; i += 4)
	{
		outVec = _mm_load_ps(output + i);
		outVec = _mm_mul_ps(outVec, volumeVec);
		_mm_store_ps(output + i, outVec);
	}

	for (i = totalSamples - tail; i < totalSamples; i += 1)
	{
		output[i] *= volume;
	}
}